

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

void interp_model_rd_eval
               (MACROBLOCK *x,AV1_COMP *cpi,BLOCK_SIZE bsize,BUFFER_SET *orig_dst,int plane_from,
               int plane_to,RD_STATS *rd_stats,int is_skip_build_pred)

{
  BLOCK_SIZE in_DL;
  AV1_COMP *in_RSI;
  MACROBLOCK *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000010;
  int mi_col;
  int mi_row;
  RD_STATS tmp_rd_stats;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  RD_STATS *rd_stats_src;
  RD_STATS *rd_stats_dst;
  BLOCK_SIZE in_stack_ffffffffffffff77;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  MACROBLOCKD *in_stack_ffffffffffffff88;
  AV1_COMMON *in_stack_ffffffffffffff90;
  int64_t iStack_68;
  int in_stack_ffffffffffffffa0;
  MACROBLOCKD *pMVar1;
  
  pMVar1 = &in_RDI->e_mbd;
  av1_init_rd_stats((RD_STATS *)&stack0xffffffffffffff80);
  if (in_stack_00000010 == 0) {
    av1_enc_build_inter_predictor
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
               in_stack_ffffffffffffff80,(BUFFER_SET *)CONCAT44(pMVar1->mi_row,pMVar1->mi_col),
               in_stack_ffffffffffffff77,in_stack_ffffffffffffffa0,(int)pMVar1);
  }
  rd_stats_src = (RD_STATS *)&stack0xffffffffffffff80;
  rd_stats_dst = (RD_STATS *)&stack0xffffffffffffff88;
  (*model_rd_sb_fn[(int)(uint)((in_RSI->sf).rt_sf.use_simple_rd_model == 0)])
            (in_RSI,in_DL,in_RDI,pMVar1,in_R8D,in_R9D,(int *)rd_stats_src,(int64_t *)rd_stats_dst,
             &stack0xffffffffffffffa0,&iStack_68,(int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
  av1_merge_rd_stats(rd_stats_dst,rd_stats_src);
  return;
}

Assistant:

static inline void interp_model_rd_eval(
    MACROBLOCK *const x, const AV1_COMP *const cpi, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int plane_from, int plane_to,
    RD_STATS *rd_stats, int is_skip_build_pred) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  RD_STATS tmp_rd_stats;
  av1_init_rd_stats(&tmp_rd_stats);

  // Skip inter predictor if the predictor is already available.
  if (!is_skip_build_pred) {
    const int mi_row = xd->mi_row;
    const int mi_col = xd->mi_col;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  plane_from, plane_to);
  }

  model_rd_sb_fn[cpi->sf.rt_sf.use_simple_rd_model
                     ? MODELRD_LEGACY
                     : MODELRD_TYPE_INTERP_FILTER](
      cpi, bsize, x, xd, plane_from, plane_to, &tmp_rd_stats.rate,
      &tmp_rd_stats.dist, &tmp_rd_stats.skip_txfm, &tmp_rd_stats.sse, NULL,
      NULL, NULL);

  av1_merge_rd_stats(rd_stats, &tmp_rd_stats);
}